

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat3 * dja::mat3::lookat(mat3 *__return_storage_ptr__,vec3 *target,vec3 *origin,vec3 *up)

{
  vec3 vVar1;
  mat3 local_fc;
  vec3 local_d8;
  vec3 local_c8;
  vec3 local_b8;
  undefined1 local_ac [8];
  vec3 z;
  float_t local_98;
  vec3 local_90;
  vec3 local_80;
  undefined1 local_70 [8];
  vec3 y;
  float_t fStack_5c;
  float_t local_58;
  vec3 local_50;
  vec3 local_40;
  undefined1 local_30 [8];
  vec3 x;
  vec3 *up_local;
  vec3 *origin_local;
  vec3 *target_local;
  
  unique0x10000118 = up;
  vVar1 = dja::operator-(origin,target);
  local_50.z = vVar1.z;
  local_40.z = local_50.z;
  local_50._0_8_ = vVar1._0_8_;
  local_40.x = local_50.x;
  local_40.y = local_50.y;
  vVar1 = normalize(&local_40);
  local_58 = vVar1.z;
  x.x = local_58;
  stack0xffffffffffffffa0 = vVar1._0_8_;
  local_30._0_4_ = y.z;
  local_30._4_4_ = fStack_5c;
  unique0x1000010c = vVar1;
  vVar1 = cross(stack0xffffffffffffffe0,(vec3 *)local_30);
  local_90.z = vVar1.z;
  local_80.z = local_90.z;
  local_90._0_8_ = vVar1._0_8_;
  local_80.x = local_90.x;
  local_80.y = local_90.y;
  vVar1 = normalize(&local_80);
  local_98 = vVar1.z;
  y.x = local_98;
  z._4_8_ = vVar1._0_8_;
  local_70._0_4_ = z.y;
  local_70._4_4_ = z.z;
  unique0x10000100 = vVar1;
  vVar1 = cross((vec3 *)local_30,(vec3 *)local_70);
  local_c8.z = vVar1.z;
  local_b8.z = local_c8.z;
  local_c8._0_8_ = vVar1._0_8_;
  local_b8.x = local_c8.x;
  local_b8.y = local_c8.y;
  local_c8 = vVar1;
  vVar1 = normalize(&local_b8);
  local_d8._0_8_ = vVar1._0_8_;
  local_ac._0_4_ = local_d8.x;
  local_ac._4_4_ = local_d8.y;
  local_d8.z = vVar1.z;
  z.x = local_d8.z;
  local_d8 = vVar1;
  mat3(&local_fc,(vec3 *)local_30,(vec3 *)local_70,(vec3 *)local_ac);
  transpose(__return_storage_ptr__,&local_fc);
  return __return_storage_ptr__;
}

Assistant:

mat3
mat3::lookat(const vec3 &target, const vec3 &origin, const vec3 &up)
{
    vec3 x = normalize(origin - target);
    vec3 y = normalize(cross(up, x));
    vec3 z = normalize(cross(x, y));

    return transpose(mat3(x, y, z));
}